

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O0

DDSInfo * __thiscall DDSInfo::PrintPixelFormatFlagNames_abi_cxx11_(DDSInfo *this,uint flags)

{
  pointer ppVar1;
  key_type local_1a4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [36];
  key_type local_174;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168 [36];
  key_type local_144;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [36];
  key_type local_114;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [36];
  key_type local_e4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [36];
  key_type local_b4;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [36];
  key_type local_84;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [52];
  key_type local_44;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [35];
  undefined1 local_15;
  uint local_14;
  DDSInfo *pDStack_10;
  uint flags_local;
  string *output;
  
  local_15 = 0;
  local_14 = flags;
  pDStack_10 = this;
  std::__cxx11::string::string((string *)this);
  if ((local_14 & 1) != 0) {
    local_44 = 1;
    local_40._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)pixel_format_flag_names_abi_cxx11_,&local_44);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_40);
    std::operator+(local_38,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_38);
  }
  if ((local_14 & 2) != 0) {
    local_84 = 2;
    local_80._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)pixel_format_flag_names_abi_cxx11_,&local_84);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_80);
    std::operator+(local_78,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_78);
  }
  if ((local_14 & 4) != 0) {
    local_b4 = 4;
    local_b0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)pixel_format_flag_names_abi_cxx11_,&local_b4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_b0);
    std::operator+(local_a8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_a8);
  }
  if ((local_14 & 0x40) != 0) {
    local_e4 = 0x40;
    local_e0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)pixel_format_flag_names_abi_cxx11_,&local_e4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_e0);
    std::operator+(local_d8,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_d8);
  }
  if ((local_14 & 0x200) != 0) {
    local_114 = 0x200;
    local_110._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)pixel_format_flag_names_abi_cxx11_,&local_114);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_110);
    std::operator+(local_108,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_108);
  }
  if ((local_14 & 0x20000) != 0) {
    local_144 = 0x20000;
    local_140._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)pixel_format_flag_names_abi_cxx11_,&local_144);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_140);
    std::operator+(local_138,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_138);
  }
  if ((local_14 & 0x40000) != 0) {
    local_174 = 0x40000;
    local_170._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)pixel_format_flag_names_abi_cxx11_,&local_174);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_170);
    std::operator+(local_168,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_168);
  }
  if ((local_14 & 0x80000) != 0) {
    local_1a4 = 0x80000;
    local_1a0._M_node =
         (_Base_ptr)
         std::
         multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((multimap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)pixel_format_flag_names_abi_cxx11_,&local_1a4);
    ppVar1 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_1a0);
    std::operator+(local_198,(char *)&ppVar1->second);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_198);
  }
  RemoveTrailingCharacter((string *)this,'|');
  return this;
}

Assistant:

std::string PrintPixelFormatFlagNames(unsigned int flags) {
    std::string output;
    #define X(a,b) ENUM_APPEND_TO_STRING(a,pixel_format_flag_names)
    #include "defs/dds/pixel_format_flags.def"
    #undef X
    RemoveTrailingCharacter(output,'|');
    return output;
  }